

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

shared_ptr<void> *
pstore::storage::segment_base_impl<pstore::storage,std::shared_ptr<void>const&>
          (storage *storage,segment_type segment)

{
  bool bVar1;
  sat_entry *this;
  undefined6 in_register_00000032;
  
  this = (sat_entry *)
         ((long)((storage->sat_)._M_t.
                 super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                 .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                _M_head_impl)->_M_elems +
         (ulong)(uint)((int)CONCAT62(in_register_00000032,segment) << 5));
  bVar1 = sat_entry::is_valid(this);
  if (bVar1) {
    return &this->value;
  }
  assert_failed("e.is_valid ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,0x109);
}

Assistant:

inline auto storage::segment_base_impl (Storage & storage,
                                            address::segment_type const segment) noexcept
        -> ResultType {
        PSTORE_ASSERT (segment < storage.sat_->size ());
        sat_entry & e = (*storage.sat_)[segment];
        PSTORE_ASSERT (e.is_valid ());
        return e.value;
    }